

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O1

int __thiscall
merlin::graphical_model::order_score(graphical_model *this,graph *g,size_t v,OrderMethod kOType)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  pointer pmVar3;
  pointer peVar4;
  index j_00;
  _Rb_tree_node_base *p_Var5;
  pointer peVar6;
  _Rb_tree_node_base *p_Var7;
  edge_id *peVar8;
  _Rb_tree_node_base *p_Var9;
  long lVar10;
  runtime_error *this_00;
  long lVar11;
  long lVar12;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_01;
  int iVar13;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> S;
  size_t j;
  undefined1 local_a8 [16];
  _Base_ptr local_98;
  _Rb_tree_node_base *p_Stack_90;
  _Rb_tree_node_base *local_88;
  pointer puStack_80;
  vsize *local_78;
  variable local_70;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  switch(kOType.t_) {
  case MinFill:
    pmVar3 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var9 = (_Rb_tree_node_base *)(local_a8 + 8);
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
    iVar13 = 0;
    local_98 = (_Base_ptr)0x0;
    puStack_80 = (pointer)0x0;
    peVar6 = *(pointer *)
              &pmVar3[v].super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
    p_Stack_90 = p_Var9;
    local_88 = p_Var9;
    if (peVar6 != *(pointer *)
                   ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                           super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8)) {
      do {
        local_60._M_impl._0_8_ = peVar6->second;
        if (peVar6->first != local_60._M_impl._0_8_ && peVar6->first == v) {
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)local_a8,(unsigned_long *)&local_60);
        }
        peVar6 = peVar6 + 1;
      } while (peVar6 != *(pointer *)
                          ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                                  super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> +
                          8));
    }
    if (p_Stack_90 != p_Var9) {
      iVar13 = 0;
      p_Var7 = p_Stack_90;
      do {
        for (p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7); p_Var5 != p_Var9;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          peVar8 = graph::edge(g,*(index *)(p_Var7 + 1),*(index *)(p_Var5 + 1));
          iVar13 = iVar13 + (uint)(peVar8->second == DAT_001914d0 &&
                                  edge_id::NO_EDGE == peVar8->first);
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != p_Var9);
    }
    this_01 = (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)local_a8;
    break;
  case WtMinFill:
    pmVar3 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    peVar6 = *(pointer *)
              &pmVar3[v].super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (peVar6 != *(pointer *)
                   ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                           super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8)) {
      do {
        local_a8._0_8_ = peVar6->second;
        if ((pointer)peVar6->first != (pointer)local_a8._0_8_ &&
            (pointer)peVar6->first == (pointer)v) {
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_60,(unsigned_long *)local_a8);
        }
        peVar6 = peVar6 + 1;
      } while (peVar6 != *(pointer *)
                          ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                                  super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> +
                          8));
    }
    local_88 = (_Rb_tree_node_base *)0x0;
    puStack_80 = (pointer)0x0;
    local_98 = (_Base_ptr)0x0;
    p_Stack_90 = (_Rb_tree_node_base *)0x0;
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_8_ = (pointer)0x0;
    local_78 = (vsize *)0x0;
    for (p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != p_Var1;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      for (p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          (_Rb_tree_header *)p_Var7 != p_Var1;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        j_00 = *(index *)(p_Var7 + 1);
        peVar8 = graph::edge(g,*(index *)(p_Var9 + 1),j_00);
        if ((edge_id::NO_EDGE == peVar8->first) && (DAT_001914d0 == peVar8->second)) {
          dVar2 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[j_00];
          local_70.m_states = (size_t)dVar2;
          local_70.m_states =
               (long)(dVar2 - 9.223372036854776e+18) & (long)local_70.m_states >> 0x3f |
               local_70.m_states;
          local_70.m_label = j_00;
          variable_set::operator|=((variable_set *)local_a8,&local_70);
        }
      }
    }
    if (local_a8._8_8_ - local_a8._0_8_ == 0) {
      lVar12 = 1;
    }
    else {
      lVar10 = (long)(local_a8._8_8_ - local_a8._0_8_) >> 3;
      lVar12 = 1;
      lVar11 = 0;
      do {
        lVar12 = lVar12 * local_78[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
    }
    iVar13 = (int)lVar12 + (uint)(lVar12 == 0);
    variable_set::~variable_set((variable_set *)local_a8);
    this_01 = &local_60;
    break;
  case MinWidth:
    pmVar3 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar6 = *(pointer *)
              &pmVar3[v].super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
    peVar4 = *(pointer *)
              ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                      super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
    if (peVar6 == peVar4) {
      return 0;
    }
    iVar13 = 0;
    do {
      if (peVar6->first == v) {
        iVar13 = iVar13 + (uint)(peVar6->first != peVar6->second);
      }
      peVar6 = peVar6 + 1;
    } while (peVar6 != peVar4);
    return iVar13;
  case WtMinWidth:
    pmVar3 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar6 = *(pointer *)
              &pmVar3[v].super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
    peVar4 = *(pointer *)
              ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                      super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
    if (peVar6 == peVar4) {
      return 0;
    }
    iVar13 = 0;
    do {
      if (peVar6->first != peVar6->second && peVar6->first == v) {
        dVar2 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[peVar6->second];
        lVar12 = (long)dVar2;
        iVar13 = iVar13 + ((uint)lVar12 |
                          (uint)(long)(dVar2 - 9.223372036854776e+18) & (uint)(lVar12 >> 0x3f));
      }
      peVar6 = peVar6 + 1;
    } while (peVar6 != peVar4);
    return iVar13;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown elimination ordering type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(this_01);
  return iVar13;
}

Assistant:

int order_score(const graph& g, size_t v, OrderMethod kOType) const {
		int s = 0.0;
		switch (kOType) {
		case OrderMethod::MinFill:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				std::set<size_t> S;
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						S.insert(j);
				}
				std::set<size_t>::iterator it1, it2;
				for (it1 = S.begin(); it1 != S.end(); ++it1) {
					it2 = it1;
					while (++it2 != S.end()) {
						size_t i = *it1, j = *it2;
						if (g.edge(i, j) == edge_id::NO_EDGE)
							++s;
					}
				}
				break;
			}
		case OrderMethod::WtMinFill:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				std::set<size_t> S;
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						S.insert(j);
				}
				variable_set vs;
				std::set<size_t>::iterator it1, it2;
				for (it1 = S.begin(); it1 != S.end(); ++it1) {
					it2 = it1;
					while (++it2 != S.end()) {
						size_t i = *it1, j = *it2;
						if (g.edge(i, j) == edge_id::NO_EDGE)
							vs |= var(j);
					}
				}
				s = vs.num_states();
				break;
			}
		case OrderMethod::MinWidth:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						++s;
				}
				break;
			}
		case OrderMethod::WtMinWidth:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						s += var(j).states();
				}
				break;
			}
		default:
			throw std::runtime_error("Unknown elimination ordering type");
			break;
		}
		return s;
	}